

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

void __thiscall Js::AsmJSByteCodeGenerator::DefineLabels(AsmJSByteCodeGenerator *this)

{
  Type pPVar1;
  code *pcVar2;
  ParseNodeStmt *this_00;
  bool bVar3;
  ByteCodeLabel BVar4;
  undefined4 *puVar5;
  Type_conflict node_00;
  Type *ppPVar6;
  ParseNodeStmt *node;
  Iterator iter;
  AsmJSByteCodeGenerator *this_local;
  
  iter.current = (NodeBase *)this;
  BVar4 = ByteCodeWriter::DefineLabel(&(this->mWriter).super_ByteCodeWriter);
  this->mInfo->singleExit = BVar4;
  SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
            ((Iterator *)&node,
             &(this->mInfo->targetStatements).
              super_SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>);
  while( true ) {
    if (iter.list == (SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_00 = node;
    node_00 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar3 = SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)this_00,
                       node_00);
    if (bVar3) break;
    iter.list = (SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)
                SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    ppPVar6 = SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&node);
    pPVar1 = *ppPVar6;
    BVar4 = ByteCodeWriter::DefineLabel(&(this->mWriter).super_ByteCodeWriter);
    pPVar1->breakLabel = BVar4;
    BVar4 = ByteCodeWriter::DefineLabel(&(this->mWriter).super_ByteCodeWriter);
    pPVar1->continueLabel = BVar4;
    pPVar1->emitLabels = true;
  }
  return;
}

Assistant:

void AsmJSByteCodeGenerator::DefineLabels()
    {
        mInfo->singleExit=mWriter.DefineLabel();
        SList<ParseNodeStmt *>::Iterator iter(&mInfo->targetStatements);
        while (iter.Next())
        {
            ParseNodeStmt * node = iter.Data();
            node->breakLabel=mWriter.DefineLabel();
            node->continueLabel=mWriter.DefineLabel();
            node->emitLabels=true;
        }
    }